

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindow.cpp
# Opt level: O1

void QMainWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  TabShape *pTVar2;
  QSize *iconSize;
  byte bVar3;
  bool bVar4;
  TabShape TVar5;
  int iVar6;
  QFlagsStorage<QMainWindow::DockOption> QVar7;
  QMainWindowLayout *pQVar8;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    puStack_40 = (undefined8 *)_a[1];
    iVar6 = 0;
    break;
  case 1:
    puStack_40 = &local_50;
    local_50 = CONCAT44(local_50._4_4_,*_a[1]);
    iVar6 = 1;
    break;
  case 2:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    iVar6 = 2;
    break;
  case 3:
    pQVar8 = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
    QVar7.i = *(uint *)(pQVar8 + 0x700) & 0xfffffffe | (uint)*_a[1];
    goto LAB_00432e2d;
  case 4:
    pQVar8 = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
    QVar7.i = (*(uint *)(pQVar8 + 0x700) & 0xfffffffd) + (uint)*_a[1] * 2;
LAB_00432e2d:
    QMainWindowLayout::setDockOptions(pQVar8,(DockOptions)QVar7.i);
  default:
    goto switchD_00432d70_default;
  }
  local_48 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_48);
switchD_00432d70_default:
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_00432d54_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == iconSizeChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_00432d54_caseD_3;
      }
      if (((code *)*plVar1 == toolButtonStyleChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_00432d54_caseD_3;
      }
      if (((code *)*plVar1 == tabifiedDockWidgetActivated) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_00432d54_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_00432d54_caseD_3;
        goto switchD_00432d54_caseD_1;
      }
    }
    goto switchD_00432d54_caseD_2;
  }
switchD_00432d54_caseD_1:
  if (7 < (uint)_id) goto LAB_00432fed;
  pTVar2 = (TabShape *)*_a;
  switch(_id) {
  case 0:
    *(undefined8 *)pTVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0x268);
    break;
  case 1:
    TVar5 = *(TabShape *)(*(long *)(_o + 8) + 0x274);
    goto LAB_00432fe9;
  case 2:
    bVar3 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700);
    goto LAB_00432fc6;
  case 3:
    bVar4 = QMainWindowLayout::documentMode(*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260));
    goto LAB_00432fc8;
  case 4:
    TVar5 = QMainWindowLayout::tabShape(*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260));
    goto LAB_00432fe9;
  case 5:
    bVar3 = *(byte *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700) >> 1;
LAB_00432fc6:
    bVar4 = (bool)(bVar3 & 1);
LAB_00432fc8:
    *(bool *)pTVar2 = bVar4;
    break;
  case 6:
    TVar5 = *(TabShape *)(*(long *)(*(long *)(_o + 8) + 0x260) + 0x700);
LAB_00432fe9:
    *pTVar2 = TVar5;
    break;
  case 7:
    *(undefined1 *)pTVar2 = Rounded;
  }
LAB_00432fed:
  if (_c != WriteProperty) goto switchD_00432d54_caseD_3;
switchD_00432d54_caseD_2:
  if (6 < (uint)_id) goto switchD_00432d54_caseD_3;
  iconSize = (QSize *)*_a;
  switch(_id) {
  case 0:
    setIconSize((QMainWindow *)_o,iconSize);
    break;
  case 1:
    setToolButtonStyle((QMainWindow *)_o,(iconSize->wd).m_i);
    break;
  case 2:
    pQVar8 = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
    QVar7.i = *(uint *)(pQVar8 + 0x700) & 0xfffffffe | (uint)(byte)(iconSize->wd).m_i;
    goto LAB_004330d4;
  case 3:
    QMainWindowLayout::setDocumentMode
              (*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260),SUB41((iconSize->wd).m_i,0));
    break;
  case 4:
    QMainWindowLayout::setTabShape
              (*(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260),(iconSize->wd).m_i);
    break;
  case 5:
    pQVar8 = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
    QVar7.i = (*(uint *)(pQVar8 + 0x700) & 0xfffffffd) + (uint)(byte)(iconSize->wd).m_i * 2;
    goto LAB_004330d4;
  case 6:
    QVar7.i = (iconSize->wd).m_i;
    pQVar8 = *(QMainWindowLayout **)(*(long *)(_o + 8) + 0x260);
LAB_004330d4:
    QMainWindowLayout::setDockOptions(pQVar8,(DockOptions)QVar7.i);
  }
switchD_00432d54_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMainWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 1: _t->toolButtonStyleChanged((*reinterpret_cast< std::add_pointer_t<Qt::ToolButtonStyle>>(_a[1]))); break;
        case 2: _t->tabifiedDockWidgetActivated((*reinterpret_cast< std::add_pointer_t<QDockWidget*>>(_a[1]))); break;
        case 3: _t->setAnimated((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->setDockNestingEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setUnifiedTitleAndToolBarOnMac((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(const QSize & )>(_a, &QMainWindow::iconSizeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(Qt::ToolButtonStyle )>(_a, &QMainWindow::toolButtonStyleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMainWindow::*)(QDockWidget * )>(_a, &QMainWindow::tabifiedDockWidgetActivated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 1: *reinterpret_cast<Qt::ToolButtonStyle*>(_v) = _t->toolButtonStyle(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isDockNestingEnabled(); break;
        case 6: QtMocHelpers::assignFlags<DockOptions>(_v, _t->dockOptions()); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->unifiedTitleAndToolBarOnMac(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 1: _t->setToolButtonStyle(*reinterpret_cast<Qt::ToolButtonStyle*>(_v)); break;
        case 2: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 5: _t->setDockNestingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDockOptions(*reinterpret_cast<DockOptions*>(_v)); break;
        case 7: _t->setUnifiedTitleAndToolBarOnMac(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}